

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

PropertyIdArray * __thiscall
Js::FunctionBody::AllocatePropertyIdArrayForFormals
          (FunctionBody *this,uint32 size,uint32 count,byte extraSlots)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Recycler *this_00;
  undefined4 *puVar4;
  PropertyIdArray *propIdArray;
  undefined7 in_register_00000009;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  local_60 = (undefined1  [8])&PropertyIdArray::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2ab601b;
  data.filename._0_4_ = 0x19a0;
  data.typeinfo = (type_info *)(ulong)size;
  this_00 = Memory::Recycler::TrackAllocInfo
                      (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                       recycler,(TrackAllocData *)local_60);
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    data._36_4_ = SUB84(CONCAT71(in_register_00000009,extraSlots),0);
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_00779708;
    *puVar4 = 0;
    extraSlots = data._36_1_;
  }
  propIdArray = (PropertyIdArray *)
                Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                          (this_00,(size_t)((type_info *)(ulong)size + 8));
  if (propIdArray == (PropertyIdArray *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_00779708:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  propIdArray->count = count;
  propIdArray->extraSlots = extraSlots;
  propIdArray->hadDuplicates = false;
  propIdArray->has__proto__ = false;
  propIdArray->hasNonSimpleParams = false;
  SetFormalsPropIdArray(this,propIdArray);
  return propIdArray;
}

Assistant:

PropertyIdArray * FunctionBody::AllocatePropertyIdArrayForFormals(uint32 size, uint32 count, byte extraSlots)
    {
        //TODO: saravind: Should the allocation be a Leaf Allocation?
        PropertyIdArray * formalsPropIdArray = RecyclerNewPlus(GetScriptContext()->GetRecycler(), size, Js::PropertyIdArray, count, extraSlots);
        SetFormalsPropIdArray(formalsPropIdArray);
        return formalsPropIdArray;
    }